

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool testing::internal::TuplePrefix<3ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<int>,testing::Matcher<mp::func::Type>>,std::tuple<int,fmt::BasicStringRef<char>,int,mp::func::Type>>
               (tuple<testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                *matcher_tuple,
               tuple<int,_fmt::BasicStringRef<char>,_int,_mp::func::Type> *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<int>,testing::Matcher<mp::func::Type>>,std::tuple<int,fmt::BasicStringRef<char>,int,mp::func::Type>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<int>::Matches
                      ((MatcherBase<int> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                        .
                        super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                        .super__Head_base<2UL,_testing::Matcher<int>,_false>,
                       (value_tuple->
                       super__Tuple_impl<0UL,_int,_fmt::BasicStringRef<char>,_int,_mp::func::Type>).
                       super__Tuple_impl<1UL,_fmt::BasicStringRef<char>,_int,_mp::func::Type>.
                       super__Tuple_impl<2UL,_int,_mp::func::Type>.super__Head_base<2UL,_int,_false>
                       ._M_head_impl);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }